

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kepulauan.h
# Opt level: O1

void __thiscall Belitung::Belitung(Belitung *this)

{
  Polygon::Polygon(&this->super_Polygon);
  Polygon::addPoint(&this->super_Polygon);
  Polygon::addPoint(&this->super_Polygon);
  Polygon::addPoint(&this->super_Polygon);
  Polygon::addPoint(&this->super_Polygon);
  Polygon::addPoint(&this->super_Polygon);
  Polygon::addPoint(&this->super_Polygon);
  Polygon::addPoint(&this->super_Polygon);
  Polygon::addPoint(&this->super_Polygon);
  Polygon::addPoint(&this->super_Polygon);
  Polygon::addPoint(&this->super_Polygon);
  Polygon::addPoint(&this->super_Polygon);
  Polygon::addPoint(&this->super_Polygon);
  Polygon::addPoint(&this->super_Polygon);
  Polygon::addPoint(&this->super_Polygon);
  return;
}

Assistant:

Belitung(){
    //addPoint(Point<double>(300, 200));
    //atas
    addPoint(Point<double>(140, 50));
    addPoint(Point<double>(250, 0));
    addPoint(Point<double>(550, 50));
    addPoint(Point<double>(650, 120));
    addPoint(Point<double>(700, 200));
    addPoint(Point<double>(650, 400));
    addPoint(Point<double>(640, 500));
    addPoint(Point<double>(700, 600));
    //lengkukan bawah
    addPoint(Point<double>(450, 600));
    addPoint(Point<double>(450, 550));
    addPoint(Point<double>(300, 450));
    addPoint(Point<double>(300, 550));
    addPoint(Point<double>(100, 600));
    addPoint(Point<double>(110, 200));
    
  }